

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

ON__UINT_PTR * __thiscall
ON_SubD_FixedSizeHeap::AllocatePtrArray(ON_SubD_FixedSizeHeap *this,uint capacity,bool bZeroMemory)

{
  ON__UINT_PTR *pOVar1;
  ON__UINT_PTR *p1;
  ON__UINT_PTR *pOVar2;
  uint uVar3;
  
  if (capacity != 0) {
    if (this->m_p != (ON__UINT_PTR *)0x0) {
      uVar3 = this->m_p_index + capacity;
      if (uVar3 <= this->m_p_capacity) {
        pOVar1 = this->m_p + this->m_p_index;
        this->m_p_index = uVar3;
        if (!bZeroMemory) {
          return pOVar1;
        }
        pOVar2 = pOVar1 + capacity;
        do {
          pOVar2[-1] = 0;
          pOVar2 = pOVar2 + -1;
        } while (pOVar1 < pOVar2);
        return pOVar1;
      }
    }
    ON_SubDIncrementErrorCount();
  }
  return (ON__UINT_PTR *)0x0;
}

Assistant:

ON__UINT_PTR* ON_SubD_FixedSizeHeap::AllocatePtrArray(
  unsigned int capacity,
  bool bZeroMemory
  )
{
  if (0 == capacity)
    return nullptr;

  if (nullptr == m_p || capacity + m_p_index > m_p_capacity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON__UINT_PTR* p = m_p + m_p_index;
  m_p_index += capacity;

  if (bZeroMemory)
  {
    ON__UINT_PTR* p1 = p + capacity;
    while (p1 > p)
    {
      *(--p1) = 0;
    }
  }

  return p;
}